

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_MASS_BANISH(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  monster *mon;
  wchar_t dam;
  wchar_t wVar5;
  uint uVar6;
  
  uVar6 = context->radius;
  if (uVar6 == 0) {
    uVar6 = (uint)z_info->max_sight;
  }
  context->ident = true;
  if (player->upkeep->arena_level == false) {
    dam = L'\0';
    wVar5 = L'\x01';
    while( true ) {
      wVar3 = cave_monster_max(cave);
      if (wVar3 <= wVar5) break;
      mon = cave_monster(cave,wVar5);
      if (mon->race != (monster_race *)0x0) {
        _Var2 = monster_is_unique(mon);
        if ((!_Var2) && ((int)(uint)mon->cdis <= (int)uVar6)) {
          delete_monster_idx((chunk *)cave,wVar5);
          uVar4 = Rand_div(3);
          dam = dam + uVar4 + L'\x01';
        }
      }
      wVar5 = wVar5 + L'\x01';
    }
    wVar5 = player_apply_damage_reduction(player,dam);
    if ((wVar5 != L'\0') && ((player->opts).opt[3] == true)) {
      msg("You take %d damage.\n",(ulong)(uint)wVar5);
    }
    take_hit(player,wVar5,"the strain of casting Mass Banishment");
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x400000;
  }
  else {
    msg("Nothing happens.");
  }
  return true;
}

Assistant:

bool effect_handler_MASS_BANISH(effect_handler_context_t *context)
{
	int i;
	int radius = context->radius ? context->radius : z_info->max_sight;
	unsigned dam = 0;

	context->ident = true;

	/* Don't allow in an arena. */
	if (player->upkeep->arena_level) {
		msg("Nothing happens.");
		return true;
	}

	/* Delete the (nearby) monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Paranoia -- Skip dead monsters */
		if (!mon->race) continue;

		/* Hack -- Skip unique monsters */
		if (monster_is_unique(mon)) continue;

		/* Skip distant monsters */
		if (mon->cdis > radius) continue;

		/* Delete the monster */
		delete_monster_idx(cave, i);

		/* Take some damage */
		dam += randint1(3);
	}

	/* Hurt the player */
	dam = player_apply_damage_reduction(player, dam);
	if (dam > 0 && OPT(player, show_damage)) {
		msg("You take %d damage.\n", dam);
	}
	take_hit(player, dam, "the strain of casting Mass Banishment");

	/* Update monster list window */
	player->upkeep->redraw |= PR_MONLIST;

	return true;
}